

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O1

int ompt_get_proc_id(void)

{
  int iVar1;
  
  if ((ompt_enabled._0_1_ & 1) != 0) {
    iVar1 = __kmp_get_global_thread_id();
    if (-1 < iVar1) {
      iVar1 = sched_getcpu();
      return iVar1;
    }
  }
  return -1;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_proc_id(void) {
  if (!ompt_enabled.enabled || __kmp_get_gtid() < 0)
    return -1;
#if KMP_OS_LINUX
  return sched_getcpu();
#elif KMP_OS_WINDOWS
  PROCESSOR_NUMBER pn;
  GetCurrentProcessorNumberEx(&pn);
  return 64 * pn.Group + pn.Number;
#else
  return -1;
#endif
}